

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.hpp
# Opt level: O3

double __thiscall
strq::Generator<double,void>::operator()
          (Generator<double,void> *this,Arithmetic<std::normal_distribution<double>_> schema)

{
  result_type rVar1;
  uint uVar2;
  ulong uVar3;
  size_t __i;
  long lVar4;
  mt19937 gen;
  anon_union_5000_2_650ea050_for_random_device_0 local_2718;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_1390;
  
  std::random_device::random_device((random_device *)&local_2718.field_0);
  uVar2 = std::random_device::_M_getval();
  local_1390._M_x[0] = (unsigned_long)uVar2;
  lVar4 = 1;
  uVar3 = local_1390._M_x[0];
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar4);
    local_1390._M_x[lVar4] = uVar3;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x270);
  local_1390._M_p = 0x270;
  std::random_device::_M_fini();
  local_2718._M_mt._M_x[2] = (unsigned_long)schema._dist._M_saved;
  local_2718._M_mt._M_x[3] = schema._dist._24_8_;
  local_2718.field_0._M_file = (void *)schema._dist._M_param._M_mean;
  local_2718.field_0._M_func = (_func_result_type_void_ptr *)schema._dist._M_param._M_stddev;
  rVar1 = std::normal_distribution<double>::operator()
                    ((normal_distribution<double> *)&local_2718.field_0,&local_1390,
                     (param_type *)&local_2718.field_0);
  return rVar1;
}

Assistant:

auto operator()(Arithmetic<Dist> schema) -> T
        {
            std::mt19937 gen{std::random_device{}()};

            if constexpr (std::is_same_v<Dist, detail::NoDistribution>) {
                return std::uniform_real_distribution<T>{}(gen);
            }
            else {
                return schema.distribution()(gen);
            }
        }